

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O1

void __thiscall
adios2::aggregator::MPIShmChain::Init
          (MPIShmChain *this,size_t numAggregators,size_t subStreams,Comm *parentComm)

{
  Comm *this_00;
  Comm *this_01;
  Comm *pCVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  MPIShmChain *pMVar9;
  MPIShmChain *this_02;
  MPIShmChain *this_03;
  float fVar10;
  HandshakeStruct hsAC;
  HandshakeStruct hs;
  HandshakeStruct local_70;
  undefined1 local_50 [24];
  Comm *local_38;
  
  if (this->PreInitCalled == false) {
    PreInit(this,parentComm);
  }
  this_00 = &this->m_NodeComm;
  local_38 = parentComm;
  iVar3 = helper::Comm::Rank(this_00);
  uVar4 = helper::Comm::Size(this_00);
  uVar2 = this->m_NumNodes;
  local_70._0_8_ = &local_70.recvRequest;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"creating aggregator groups at Open","");
  pCVar1 = local_38;
  uVar8 = (ulong)(int)uVar4;
  uVar7 = 1;
  if (uVar2 <= numAggregators) {
    uVar7 = numAggregators / uVar2;
  }
  if (uVar8 <= uVar7) {
    uVar7 = uVar8;
  }
  if ((long)uVar8 < 0) {
    fVar10 = (float)((ulong)(uVar4 & 1) | uVar8 >> 1);
    fVar10 = fVar10 + fVar10;
  }
  else {
    fVar10 = (float)(int)uVar4;
  }
  helper::Comm::Split((Comm *)local_50,(int)this_00,(int)((float)iVar3 / (fVar10 / (float)uVar7)),
                      (string *)0x0);
  this_01 = &(this->super_MPIAggregator).m_Comm;
  helper::Comm::operator=(this_01,(Comm *)local_50);
  helper::Comm::~Comm((Comm *)local_50);
  if ((Req *)local_70._0_8_ != &local_70.recvRequest) {
    operator_delete((void *)local_70._0_8_);
  }
  iVar5 = helper::Comm::Rank(this_01);
  (this->super_MPIAggregator).m_Rank = iVar5;
  iVar5 = helper::Comm::Size(this_01);
  (this->super_MPIAggregator).m_Size = iVar5;
  if ((this->super_MPIAggregator).m_Rank == 0) {
    iVar5 = helper::Comm::Rank(pCVar1);
    (this->super_MPIAggregator).m_AggregatorRank = iVar5;
  }
  else {
    (this->super_MPIAggregator).m_IsAggregator = false;
    this->m_IsMasterAggregator = false;
  }
  iVar5 = helper::Comm::BroadcastValue<int>(this_01,&(this->super_MPIAggregator).m_AggregatorRank,0)
  ;
  (this->super_MPIAggregator).m_AggregatorRank = iVar5;
  iVar5 = (this->super_MPIAggregator).m_Rank;
  local_70._0_8_ = &local_70.recvRequest;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"creating comm of all aggregators at Open","");
  helper::Comm::Split((Comm *)local_50,(int)pCVar1,(uint)(iVar5 != 0),(string *)0x0);
  pCVar1 = &this->m_AllAggregatorsComm;
  helper::Comm::operator=(pCVar1,(Comm *)local_50);
  helper::Comm::~Comm((Comm *)local_50);
  if ((Req *)local_70._0_8_ != &local_70.recvRequest) {
    operator_delete((void *)local_70._0_8_);
  }
  if (iVar3 == 0) {
    iVar3 = helper::Comm::Size(pCVar1);
    (this->super_MPIAggregator).m_NumAggregators = (long)iVar3;
  }
  uVar6 = helper::Comm::BroadcastValue<unsigned_long>
                    (this_00,&(this->super_MPIAggregator).m_NumAggregators,0);
  if (subStreams == 0) {
    subStreams = uVar6;
  }
  if (uVar6 <= subStreams) {
    subStreams = uVar6;
  }
  (this->super_MPIAggregator).m_NumAggregators = uVar6;
  (this->super_MPIAggregator).m_SubStreams = subStreams;
  if ((this->super_MPIAggregator).m_Rank == 0) {
    uVar2 = (this->super_MPIAggregator).m_SubStreams;
    iVar3 = helper::Comm::Rank(pCVar1);
    (this->super_MPIAggregator).m_SubStreamIndex =
         (long)(int)((float)iVar3 / ((float)uVar6 / (float)uVar2));
  }
  uVar6 = helper::Comm::BroadcastValue<unsigned_long>
                    (this_01,&(this->super_MPIAggregator).m_SubStreamIndex,0);
  (this->super_MPIAggregator).m_SubStreamIndex = uVar6;
  local_70._0_8_ = &local_70.recvRequest;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"creating chains of aggregators at Open","");
  helper::Comm::Split((Comm *)local_50,(int)pCVar1,(int)uVar6,(string *)0x0);
  this_03 = (MPIShmChain *)&this->m_AggregatorChainComm;
  helper::Comm::operator=((Comm *)this_03,(Comm *)local_50);
  helper::Comm::~Comm((Comm *)local_50);
  if ((Req *)local_70._0_8_ != &local_70.recvRequest) {
    operator_delete((void *)local_70._0_8_);
  }
  iVar3 = helper::Comm::Rank((Comm *)this_03);
  if (iVar3 != 0) {
    this->m_IsMasterAggregator = false;
  }
  helper::Comm::Req::Req(&local_70.sendRequest);
  helper::Comm::Req::Req(&local_70.recvRequest);
  pMVar9 = this_03;
  iVar3 = helper::Comm::Size((Comm *)this_03);
  if (1 < iVar3) {
    HandshakeLinks_Start(pMVar9,(Comm *)this_03,&local_70);
  }
  (this->super_MPIAggregator).m_IsActive = true;
  iVar3 = helper::Comm::Size(this_01);
  if (1 < iVar3) {
    helper::Comm::Req::Req((Req *)(local_50 + 8));
    pMVar9 = (MPIShmChain *)(local_50 + 0x10);
    this_02 = pMVar9;
    helper::Comm::Req::Req((Req *)pMVar9);
    HandshakeLinks_Start(this_02,this_01,(HandshakeStruct *)local_50);
    HandshakeLinks_Complete(this_02,(HandshakeStruct *)local_50);
    helper::Comm::Req::~Req((Req *)pMVar9);
    helper::Comm::Req::~Req((Req *)(local_50 + 8));
  }
  iVar3 = helper::Comm::Size((Comm *)this_03);
  if (1 < iVar3) {
    HandshakeLinks_Complete(this_03,&local_70);
  }
  helper::Comm::Req::~Req(&local_70.recvRequest);
  helper::Comm::Req::~Req(&local_70.sendRequest);
  return;
}

Assistant:

void MPIShmChain::Init(const size_t numAggregators, const size_t subStreams,
                       helper::Comm const &parentComm)
{
    if (!PreInitCalled)
    {
        PreInit(parentComm);
    }

    // int AllRank = parentComm.Rank();
    // int AllSize = parentComm.Size();
    int NodeRank = m_NodeComm.Rank();
    size_t NodeSize = static_cast<size_t>(m_NodeComm.Size());

    /* Number of aggregators per node */
    size_t aggregatorPerNode = numAggregators / m_NumNodes;
    if (aggregatorPerNode == 0)
    {
        aggregatorPerNode = 1; /* default */
    }
    if (aggregatorPerNode > NodeSize)
    {
        aggregatorPerNode = NodeSize;
    }

    /* Create main communicator that splits the node comm into one or more
     * aggregator chains */
    float k = static_cast<float>(NodeSize) / static_cast<float>(aggregatorPerNode);
    float c = static_cast<float>(NodeRank) / k;
    int color = static_cast<int>(c);
    m_Comm = m_NodeComm.Split(color, 0, "creating aggregator groups at Open");
    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();
    if (m_Rank != 0)
    {
        m_IsAggregator = false;
        m_IsMasterAggregator = false;
    }

    /* Identify parent rank of aggregator process within each chain */
    if (!m_Rank)
    {
        m_AggregatorRank = parentComm.Rank();
    }
    m_AggregatorRank = m_Comm.BroadcastValue<int>(m_AggregatorRank, 0);

    /* Communicator for all Aggregators */
    color = (m_Rank ? 1 : 0);
    m_AllAggregatorsComm = parentComm.Split(color, 0, "creating comm of all aggregators at Open");

    /* Total number of aggregators */
    if (!NodeRank)
    {
        m_NumAggregators = static_cast<size_t>(m_AllAggregatorsComm.Size());
    }
    m_NumAggregators = m_NodeComm.BroadcastValue<size_t>(m_NumAggregators);

    /* Number of substreams */
    m_SubStreams = subStreams;
    if (m_SubStreams == 0)
    {
        m_SubStreams = m_NumAggregators; /* default */
    }
    if (m_SubStreams > m_NumAggregators)
    {
        m_SubStreams = m_NumAggregators;
    }

    if (!m_Rank)
    {
        k = static_cast<float>(m_NumAggregators) / static_cast<float>(m_SubStreams);
        /* 1.0 <= k <= m_NumAggregators */
        c = static_cast<float>(m_AllAggregatorsComm.Rank()) / k;
        m_SubStreamIndex = static_cast<int>(c);
    }
    m_SubStreamIndex = m_Comm.BroadcastValue<size_t>(m_SubStreamIndex);

    /* Create the communicator to connect aggregators writing to the same
     * substream */
    color = static_cast<int>(m_SubStreamIndex);
    m_AggregatorChainComm =
        m_AllAggregatorsComm.Split(color, 0, "creating chains of aggregators at Open");

    if (m_AggregatorChainComm.Rank() != 0)
    {
        m_IsMasterAggregator = false;
    }
    HandshakeStruct hsAC; // need persistence until complete
    if (m_AggregatorChainComm.Size() > 1)
    {
        HandshakeLinks_Start(m_AggregatorChainComm, hsAC);
    }

    m_IsActive = true;

    if (m_Comm.Size() > 1)
    {
        HandshakeStruct hs; // need persistence until complete
        HandshakeLinks_Start(m_Comm, hs);

        /* Create the shared memory segment */
        // CreateShm();

        HandshakeLinks_Complete(hs);
    }

    if (m_AggregatorChainComm.Size() > 1)
    {
        HandshakeLinks_Complete(hsAC);
    }
}